

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O0

void __thiscall ccs::RuleBuilder::Impl::set(Impl *this,string *name,string *value)

{
  pointer pPVar1;
  pointer this_00;
  unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> local_58;
  StringVal local_50;
  unique_ptr<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_> local_28;
  __single_object def;
  string *value_local;
  string *name_local;
  Impl *this_local;
  
  def._M_t.super___uniq_ptr_impl<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_>._M_t.
  super__Tuple_impl<0UL,_ccs::ast::PropDef_*,_std::default_delete<ccs::ast::PropDef>_>.
  super__Head_base<0UL,_ccs::ast::PropDef_*,_false>._M_head_impl =
       (__uniq_ptr_data<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>,_true,_true>)
       (__uniq_ptr_data<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>,_true,_true>)value
  ;
  std::make_unique<ccs::ast::PropDef>();
  pPVar1 = std::unique_ptr<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_>::operator->
                     (&local_28);
  std::__cxx11::string::operator=((string *)&pPVar1->name_,(string *)name);
  pPVar1 = std::unique_ptr<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_>::operator->
                     (&local_28);
  StringVal::StringVal
            (&local_50,
             (string *)
             def._M_t.
             super___uniq_ptr_impl<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_>._M_t.
             super__Tuple_impl<0UL,_ccs::ast::PropDef_*,_std::default_delete<ccs::ast::PropDef>_>.
             super__Head_base<0UL,_ccs::ast::PropDef_*,_false>._M_head_impl);
  Value::setString(&pPVar1->value_,&local_50);
  StringVal::~StringVal(&local_50);
  this_00 = std::unique_ptr<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>::operator->
                      (&this->ast);
  std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>::
  unique_ptr<ccs::ast::PropDef,std::default_delete<ccs::ast::PropDef>,void>
            ((unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>> *)&local_58,
             &local_28);
  ast::Nested::addRule(this_00,&local_58);
  std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<ccs::ast::PropDef,_std::default_delete<ccs::ast::PropDef>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

void set(const std::string &name, const std::string &value) {
    auto def = std::make_unique<ast::PropDef>();
    def->name_ = name;
    def->value_.setString(StringVal(value));
    ast->addRule(std::move(def));
  }